

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamDeviceFactory_p.cpp
# Opt level: O0

IBamIODevice * BamTools::Internal::BamDeviceFactory::CreateDevice(string *source)

{
  bool bVar1;
  long lVar2;
  IBamIODevice *pIVar3;
  char *in_RDI;
  BamHttp *unaff_retaddr;
  string *in_stack_00000018;
  BamFtp *in_stack_00000020;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  BamFile *in_stack_ffffffffffffffd0;
  string *in_stack_fffffffffffffff8;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (((bVar1) ||
      (bVar1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar1)) ||
     (bVar1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar1)) {
    pIVar3 = (IBamIODevice *)operator_new(0x38);
    BamPipe::BamPipe((BamPipe *)in_stack_ffffffffffffffc0);
    return pIVar3;
  }
  lVar2 = std::__cxx11::string::find(in_RDI,0x1ecb3f);
  if (lVar2 == 0) {
    pIVar3 = (IBamIODevice *)operator_new(200);
    BamHttp::BamHttp(unaff_retaddr,in_stack_fffffffffffffff8);
    return pIVar3;
  }
  lVar2 = std::__cxx11::string::find(in_RDI,0x1ecb47);
  if (lVar2 == 0) {
    pIVar3 = (IBamIODevice *)operator_new(0x120);
    BamFtp::BamFtp(in_stack_00000020,in_stack_00000018);
    return pIVar3;
  }
  pIVar3 = (IBamIODevice *)operator_new(0x58);
  BamFile::BamFile(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return pIVar3;
}

Assistant:

IBamIODevice* BamDeviceFactory::CreateDevice(const string& source) {

    // check for requested pipe
    if ( source == "-" || source == "stdin" || source == "stdout" )
        return new BamPipe;

    // check for HTTP prefix
    if ( source.find("http://") == 0 )
        return new BamHttp(source);

    // check for FTP prefix
    if ( source.find("ftp://") == 0 )
        return new BamFtp(source);

    // otherwise assume a "normal" file
    return new BamFile(source);
}